

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O1

void secp256k1_rangeproof_pub_expand
               (secp256k1_gej *pubs,int exp,size_t *rsizes,size_t rings,secp256k1_ge *genp)

{
  secp256k1_fe *rzr;
  ulong uVar1;
  ulong uVar2;
  secp256k1_gej *a;
  long lVar3;
  secp256k1_gej base;
  secp256k1_gej tmp;
  secp256k1_gej local_148;
  secp256k1_gej *local_c8;
  ulong local_c0;
  secp256k1_gej local_b8;
  
  local_148.infinity = genp->infinity;
  local_148.x.n[0] = (genp->x).n[0];
  local_148.x.n[1] = (genp->x).n[1];
  local_148.x.n[2] = (genp->x).n[2];
  local_148.x.n[3] = (genp->x).n[3];
  local_148.x.n[4] = (genp->x).n[4];
  local_148.y.n[0] = (genp->y).n[0];
  local_148.y.n[1] = (genp->y).n[1];
  local_148.y.n[2] = (genp->y).n[2];
  local_148.y.n[3] = (genp->y).n[3];
  local_148.y.n[4] = (genp->y).n[4];
  local_148.z.n[0] = 1;
  local_148.z.n[1] = 0;
  local_148.z.n[2] = 0;
  local_148.z.n[3] = 0;
  local_148.z.n[4] = 0;
  rzr = (secp256k1_fe *)rings;
  local_c8 = pubs;
  secp256k1_gej_neg(&local_148,&local_148);
  if (0 < exp) {
    do {
      if (local_148.infinity == 0) {
        secp256k1_gej_double(&local_b8,&local_148);
      }
      else {
        local_b8.infinity = 1;
        local_b8.x.n[0] = 0;
        local_b8.x.n[1] = 0;
        local_b8.x.n[2] = 0;
        local_b8.x.n[3] = 0;
        local_b8.x.n[4] = 0;
        local_b8.y.n[0] = 0;
        local_b8.y.n[1] = 0;
        local_b8.y.n[2] = 0;
        local_b8.y.n[3] = 0;
        local_b8.y.n[4] = 0;
        local_b8.z.n[0] = 0;
        local_b8.z.n[1] = 0;
        local_b8.z.n[2] = 0;
        local_b8.z.n[3] = 0;
        local_b8.z.n[4] = 0;
      }
      if (local_b8.infinity == 0) {
        secp256k1_gej_double(&local_148,&local_b8);
      }
      else {
        local_148.infinity = 1;
        local_148.x.n[0] = 0;
        local_148.x.n[1] = 0;
        local_148.x.n[2] = 0;
        local_148.x.n[3] = 0;
        local_148.x.n[4] = 0;
        local_148.y.n[0] = 0;
        local_148.y.n[1] = 0;
        local_148.y.n[2] = 0;
        local_148.y.n[3] = 0;
        local_148.y.n[4] = 0;
        local_148.z.n[0] = 0;
        local_148.z.n[1] = 0;
        local_148.z.n[2] = 0;
        local_148.z.n[3] = 0;
        local_148.z.n[4] = 0;
      }
      if (local_148.infinity == 0) {
        secp256k1_gej_double(&local_148,&local_148);
      }
      else {
        local_148.infinity = 1;
        local_148.x.n[0] = 0;
        local_148.x.n[1] = 0;
        local_148.x.n[2] = 0;
        local_148.x.n[3] = 0;
        local_148.x.n[4] = 0;
        local_148.y.n[0] = 0;
        local_148.y.n[1] = 0;
        local_148.y.n[2] = 0;
        local_148.y.n[3] = 0;
        local_148.y.n[4] = 0;
        local_148.z.n[0] = 0;
        local_148.z.n[1] = 0;
        local_148.z.n[2] = 0;
        local_148.z.n[3] = 0;
        local_148.z.n[4] = 0;
      }
      exp = exp + -1;
      secp256k1_gej_add_var(&local_148,&local_148,&local_b8,rzr);
    } while (exp != 0);
  }
  if (rings != 0) {
    local_c0 = rings - 1;
    lVar3 = 0;
    uVar1 = 0;
    do {
      if (1 < rsizes[uVar1]) {
        uVar2 = 1;
        a = local_c8 + lVar3;
        do {
          secp256k1_gej_add_var(a + 1,a,&local_148,rzr);
          uVar2 = uVar2 + 1;
          a = a + 1;
        } while (uVar2 < rsizes[uVar1]);
      }
      if (uVar1 < local_c0) {
        if (local_148.infinity == 0) {
          secp256k1_gej_double(&local_148,&local_148);
        }
        else {
          local_148.infinity = 1;
          local_148.x.n[0] = 0;
          local_148.x.n[1] = 0;
          local_148.x.n[2] = 0;
          local_148.x.n[3] = 0;
          local_148.x.n[4] = 0;
          local_148.y.n[0] = 0;
          local_148.y.n[1] = 0;
          local_148.y.n[2] = 0;
          local_148.y.n[3] = 0;
          local_148.y.n[4] = 0;
          local_148.z.n[0] = 0;
          local_148.z.n[1] = 0;
          local_148.z.n[2] = 0;
          local_148.z.n[3] = 0;
          local_148.z.n[4] = 0;
        }
        if (local_148.infinity == 0) {
          secp256k1_gej_double(&local_148,&local_148);
        }
        else {
          local_148.infinity = 1;
          local_148.x.n[0] = 0;
          local_148.x.n[1] = 0;
          local_148.x.n[2] = 0;
          local_148.x.n[3] = 0;
          local_148.x.n[4] = 0;
          local_148.y.n[0] = 0;
          local_148.y.n[1] = 0;
          local_148.y.n[2] = 0;
          local_148.y.n[3] = 0;
          local_148.y.n[4] = 0;
          local_148.z.n[0] = 0;
          local_148.z.n[1] = 0;
          local_148.z.n[2] = 0;
          local_148.z.n[3] = 0;
          local_148.z.n[4] = 0;
        }
      }
      lVar3 = lVar3 + rsizes[uVar1];
      uVar1 = uVar1 + 1;
    } while (uVar1 != rings);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_rangeproof_pub_expand(secp256k1_gej *pubs,
 int exp, size_t *rsizes, size_t rings, const secp256k1_ge* genp) {
    secp256k1_gej base;
    size_t i;
    size_t j;
    size_t npub;
    VERIFY_CHECK(exp < 19);
    if (exp < 0) {
        exp = 0;
    }
    secp256k1_gej_set_ge(&base, genp);
    secp256k1_gej_neg(&base, &base);
    while (exp--) {
        /* Multiplication by 10 */
        secp256k1_gej tmp;
        secp256k1_gej_double_var(&tmp, &base, NULL);
        secp256k1_gej_double_var(&base, &tmp, NULL);
        secp256k1_gej_double_var(&base, &base, NULL);
        secp256k1_gej_add_var(&base, &base, &tmp, NULL);
    }
    npub = 0;
    for (i = 0; i < rings; i++) {
        for (j = 1; j < rsizes[i]; j++) {
            secp256k1_gej_add_var(&pubs[npub + j], &pubs[npub + j - 1], &base, NULL);
        }
        if (i < rings - 1) {
            secp256k1_gej_double_var(&base, &base, NULL);
            secp256k1_gej_double_var(&base, &base, NULL);
        }
        npub += rsizes[i];
    }
}